

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span-main.t.hpp
# Opt level: O0

ostream * nonstd::span_lite::operator<<(ostream *os,span<char,_18446744073709551615UL> *v)

{
  ostream *poVar1;
  reference chr;
  bool local_b9;
  lest local_b8 [34];
  byte local_96;
  byte local_95;
  byte local_82;
  allocator local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  span<char,_18446744073709551615UL> *local_20;
  span<char,_18446744073709551615UL> *v_local;
  ostream *os_local;
  
  local_20 = v;
  v_local = (span<char,_18446744073709551615UL> *)os;
  poVar1 = std::operator<<(os,"[span:");
  local_b9 = span<char,_18446744073709551615UL>::empty(local_20);
  local_82 = 0;
  local_95 = 0;
  local_96 = 0;
  if (local_b9) {
    std::allocator<char>::allocator();
    local_82 = 1;
    std::__cxx11::string::string(local_80,"[empty]",&local_81);
    local_95 = 1;
    std::__cxx11::string::string(local_60,local_80);
    local_96 = 1;
    std::__cxx11::string::string(local_40,local_60);
  }
  else {
    chr = span<char,_18446744073709551615UL>::operator[](local_20,0);
    lest::to_string_abi_cxx11_(local_b8,chr);
    std::__cxx11::string::string(local_40,(string *)local_b8);
  }
  local_b9 = !local_b9;
  poVar1 = std::operator<<(poVar1,local_40);
  os_local = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_40);
  if (local_b9) {
    std::__cxx11::string::~string((string *)local_b8);
  }
  if ((local_96 & 1) != 0) {
    std::__cxx11::string::~string(local_60);
  }
  if ((local_95 & 1) != 0) {
    std::__cxx11::string::~string(local_80);
  }
  if ((local_82 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return os_local;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, span<T> const & v )
{
    using lest::to_string;
    return os << "[span:" << (v.empty() ? "[empty]" : to_string( v[0] ) ) << "]";
}